

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  float *scl_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int i;
  long lVar3;
  float (*pafVar4) [3];
  long lVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vec2<float> VVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vec2<float> local_48 [2];
  float local_34;
  
  local_48[0].x = *(float *)((long)(mat->x + 0) + 0);
  local_48[0].y = *(float *)((long)(mat->x + 0) + 4);
  local_48[1] = *(Vec2<float> *)mat->x[1];
  local_34 = 0.0;
  pafVar4 = (float (*) [3])mat;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      fVar6 = (*(float (*) [3])*pafVar4)[lVar5];
      if (fVar6 <= -fVar6) {
        fVar6 = -fVar6;
      }
      if (fVar6 <= local_34) {
        fVar6 = local_34;
      }
      local_34 = fVar6;
    }
    pafVar4 = pafVar4 + 1;
  }
  if ((local_34 != 0.0) || (NAN(local_34))) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
      bVar2 = checkForZeroScaleInRow<float>
                        (&local_34,(Vec2<float> *)((long)&local_48[0].x + lVar3),exc);
      if (!bVar2) {
        return false;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)&local_48[0].x + lVar3);
      auVar11._4_4_ = local_34;
      auVar11._0_4_ = local_34;
      auVar11._8_8_ = 0;
      auVar7 = divps(auVar7,auVar11);
      *(long *)((long)&local_48[0].x + lVar3) = auVar7._0_8_;
    }
  }
  fVar6 = Vec2<float>::length(local_48);
  scl->x = fVar6;
  bVar2 = checkForZeroScaleInRow<float>(&scl->x,local_48,exc);
  if (bVar2) {
    fVar6 = scl->x;
    auVar8._4_4_ = fVar6;
    auVar8._0_4_ = fVar6;
    auVar8._8_4_ = fVar6;
    auVar8._12_4_ = fVar6;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_48[0].x;
    auVar12._4_4_ = local_48[0].y;
    auVar7 = divps(auVar12,auVar8);
    local_48[0] = auVar7._0_8_;
    fVar6 = auVar7._0_4_ * local_48[1].x + auVar7._4_4_ * local_48[1].y;
    *shr = fVar6;
    local_48[1] = (Vec2<float>)
                  CONCAT44(local_48[1].y - fVar6 * auVar7._4_4_,local_48[1].x - fVar6 * auVar7._0_4_
                          );
    fVar6 = Vec2<float>::length(local_48 + 1);
    scl_00 = &scl->y;
    scl->y = fVar6;
    bVar2 = checkForZeroScaleInRow<float>(scl_00,local_48 + 1,exc);
    if (bVar2) {
      fVar6 = *scl_00;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = local_48[1].x;
      auVar9._4_4_ = local_48[1].y;
      auVar1._4_4_ = fVar6;
      auVar1._0_4_ = fVar6;
      auVar1._8_4_ = fVar6;
      auVar1._12_4_ = fVar6;
      auVar7 = divps(auVar9,auVar1);
      local_48[1] = auVar7._0_8_;
      *shr = *shr / fVar6;
      if (auVar7._4_4_ * local_48[0].x - local_48[0].y * auVar7._0_4_ < 0.0) {
        local_48[1] = (Vec2<float>)((ulong)local_48[1] ^ 0x8000000080000000);
        *scl_00 = -*scl_00;
        *shr = -*shr;
      }
      *(float *)((long)(mat->x + 0) + 0) = local_48[0].x;
      *(float *)((long)(mat->x + 0) + 4) = local_48[0].y;
      *(float *)((long)(mat->x + 1) + 0) = local_48[1].x;
      *(float *)((long)(mat->x + 1) + 4) = local_48[1].y;
      VVar10.x = local_34 * (*scl).x;
      VVar10.y = local_34 * (*scl).y;
      *scl = VVar10;
      return true;
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix33<T>& mat, Vec2<T>& scl, T& shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);

    T maxVal = 0;
    for (int i = 0; i < 2; i++)
        for (int j = 0; j < 2; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 2; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY
    // shear factor because we can effect the an YX shear factor by
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y)
    // and shear(XY) factors to compensate.
    if (row[0].x * row[1].y - row[0].y * row[1].x < 0)
    {
        row[1].x *= -1;
        row[1].y *= -1;
        scl.y *= -1;
        shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 2; i++)
    {
        mat[i][0] = row[i].x;
        mat[i][1] = row[i].y;
    }

    scl *= maxVal;

    return true;
}